

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roster.cpp
# Opt level: O2

void __thiscall Roster::printInvalidEmails(Roster *this)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  string currentEmail;
  string local_50;
  
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    Student::getEmail_abi_cxx11_(&local_50,this->classRosterArray[lVar3]);
    lVar1 = std::__cxx11::string::find((char *)&local_50,0x1040f9);
    if (lVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
      poVar2 = std::operator<<(poVar2," ---> Missing \'@\' character in email");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    lVar1 = std::__cxx11::string::find((char *)&local_50,0x1040e0);
    if (lVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
      poVar2 = std::operator<<(poVar2," ---> Missing \'.\' character in email");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    lVar1 = std::__cxx11::string::find((char *)&local_50,0x10403b);
    if (lVar1 != -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,"---> White space not allowed in email");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Roster::printInvalidEmails() {
    for (int i = 0; i < ARRAY_LENGTH; i++) {
        string currentEmail = classRosterArray[i]->getEmail();

        size_t foundAtSymbol = currentEmail.find("@");
        if (foundAtSymbol == string::npos) {
            cout << currentEmail << " ---> Missing '@' character in email" << endl;
        }

        size_t foundPeriod = currentEmail.find(".");
        if (foundPeriod == string::npos) {
            cout << currentEmail << " ---> Missing '.' character in email" << endl;
        }

        size_t foundWhiteSpace = currentEmail.find(" ");
        if (foundWhiteSpace != string::npos) {
            cout << currentEmail << "---> White space not allowed in email" << endl;
        }
    }
}